

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::GetDefExpandList
          (cmMakefile *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,bool emptyArgs)

{
  string_view arg;
  bool bVar1;
  string *this_00;
  cmValue local_38;
  cmValue def;
  bool emptyArgs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  string *name_local;
  cmMakefile *this_local;
  
  def.Value._7_1_ = emptyArgs;
  local_38 = GetDefinition(this,name);
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar1) {
    this_00 = cmValue::operator*[abi_cxx11_(&local_38);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    cmExpandList(arg,out,(bool)(def.Value._7_1_ & 1));
  }
  return bVar1;
}

Assistant:

bool cmMakefile::GetDefExpandList(const std::string& name,
                                  std::vector<std::string>& out,
                                  bool emptyArgs) const
{
  cmValue def = this->GetDefinition(name);
  if (!def) {
    return false;
  }
  cmExpandList(*def, out, emptyArgs);
  return true;
}